

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O1

FilterPropagateResult __thiscall
duckdb::IsNotNullFilter::CheckStatistics(IsNotNullFilter *this,BaseStatistics *stats)

{
  bool bVar1;
  FilterPropagateResult FVar2;
  
  bVar1 = BaseStatistics::CanHaveNoNull(stats);
  FVar2 = FILTER_ALWAYS_FALSE;
  if (bVar1) {
    bVar1 = BaseStatistics::CanHaveNull(stats);
    FVar2 = !bVar1;
  }
  return FVar2;
}

Assistant:

FilterPropagateResult IsNotNullFilter::CheckStatistics(BaseStatistics &stats) {
	if (!stats.CanHaveNoNull()) {
		// no non-null values are possible: always false
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	}
	if (!stats.CanHaveNull()) {
		// no null values are possible: always true
		return FilterPropagateResult::FILTER_ALWAYS_TRUE;
	}
	return FilterPropagateResult::NO_PRUNING_POSSIBLE;
}